

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCodeAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::writeValueTo
          (TypedAttribute<Imf_2_5::TimeCode> *this,OStream *os,int version)

{
  uint uVar1;
  undefined8 in_RAX;
  uint local_18;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  uVar1 = TimeCode::timeAndFlags(&this->_value,TV60_PACKING);
  _local_18 = CONCAT44(local_14,uVar1);
  (*os->_vptr_OStream[2])(os,&local_18,4);
  uVar1 = TimeCode::userData(&this->_value);
  _local_18 = CONCAT44(uVar1,local_18);
  (*os->_vptr_OStream[2])(os,&local_14,4);
  return;
}

Assistant:

void
TimeCodeAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.timeAndFlags());
    Xdr::write <StreamIO> (os, _value.userData());
}